

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O3

string * __thiscall
jsonnet::internal::StaticError::toString_abi_cxx11_
          (string *__return_storage_ptr__,StaticError *this)

{
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if ((this->location).begin.line != 0) {
    operator<<(local_190,&this->location);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,":",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_190," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(this->msg)._M_dataplus._M_p,(this->msg)._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const
    {
        std::stringstream ss;
        if (location.isSet()) {
            ss << location << ":";
        }
        ss << " " << msg;
        return ss.str();
    }